

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>::
DeleteProperty(SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>
               *this,DynamicObject *instance,JavascriptString *propertyNameString,
              PropertyOperationFlags propertyOperationFlags)

{
  RecyclerWeakReference<Js::DynamicObject> *pRVar1;
  code *pcVar2;
  uint uVar3;
  ScriptContext *this_00;
  DynamicObject *pDVar4;
  bool bVar5;
  charcount_t cVar6;
  int iVar7;
  PropertyId propertyId;
  BOOL BVar8;
  undefined4 *puVar9;
  char16 *pcVar10;
  undefined4 extraout_var;
  RecyclableObject *pRVar11;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *this_01;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true> *pSVar12;
  Type *pTVar13;
  byte bVar14;
  CharacterBuffer<char16_t> local_68;
  RecyclableObject *local_58;
  ScriptContext *local_50;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *local_48;
  DynamicObject *local_40;
  PropertyOperationFlags local_34;
  
  local_34 = propertyOperationFlags;
  puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  while( true ) {
    pcVar10 = JavascriptString::GetString(propertyNameString);
    cVar6 = JavascriptString::GetLength(propertyNameString);
    bVar5 = PropertyRecord::IsPropertyNameNumeric(pcVar10,cVar6);
    if (bVar5) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x617,
                                  "(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()))"
                                  ,
                                  "Numeric property names should have been converted to uint or PropertyRecord* "
                                 );
      if (!bVar5) goto LAB_00c5e2ff;
      *puVar9 = 0;
    }
    bVar14 = (this->super_DynamicTypeHandler).flags;
    if ((bVar14 & 4) == 0) break;
    this = ConvertToNonSharedSimpleDictionaryType(this,instance);
  }
  if ((DAT_0145c35c == '\x01') && ((this->field_0x28 & 6) == 0)) {
    pSVar12 = &SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>::
               ConvertToSimpleDictionaryUnorderedTypeHandler<unsigned_short,Js::JavascriptString*,true>
                         ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>
                           *)this,instance)->
               super_SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true>;
    BVar8 = SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true>::
            DeleteProperty(pSVar12,instance,propertyNameString,local_34);
    return BVar8;
  }
  pTVar13 = (instance->super_RecyclableObject).type.ptr;
  if (*(char *)&pTVar13[1].javascriptLibrary.ptr == '\x01') {
    if (((bVar14 & 0x10) != 0) || (*(char *)((long)&pTVar13[1].javascriptLibrary.ptr + 1) == '\x01')
       ) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x627,
                                  "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())",
                                  "!GetIsShared() && !instance->GetDynamicType()->GetIsShared()");
      if (!bVar5) goto LAB_00c5e2ff;
      *puVar9 = 0;
    }
    DynamicObject::ChangeType(instance);
    pTVar13 = (instance->super_RecyclableObject).type.ptr;
  }
  local_50 = (((pTVar13->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  local_58 = (RecyclableObject *)JavascriptString::GetString(propertyNameString);
  cVar6 = JavascriptString::GetLength(propertyNameString);
  Memory::WriteBarrierPtr<const_char16_t>::WriteBarrierSet(&local_68.string,(char16_t *)local_58);
  local_68.len = cVar6;
  bVar5 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
          ::TryGetReference<JsUtil::CharacterBuffer<char16_t>>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_68,&local_48);
  if ((bVar5) && (bVar14 = local_48->Attributes, (bVar14 & 8) == 0)) {
    if ((bVar14 & 2) == 0) {
      pcVar10 = JavascriptString::GetString(propertyNameString);
      JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable(local_34,local_50,pcVar10);
      return 0;
    }
    local_40 = instance;
    if ((bVar14 & 0x10) != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x643,"(!(descriptor->Attributes & 0x10))",
                                  "!(descriptor->Attributes & PropertyLetConstGlobal)");
      if (!bVar5) goto LAB_00c5e2ff;
      *puVar9 = 0;
    }
    pDVar4 = local_40;
    uVar3 = DAT_0145c358;
    if (local_48->propertyIndex != 0xffff) {
      pRVar11 = (((local_50->super_ScriptContextBase).javascriptLibrary)->
                super_JavascriptLibraryBase).undefinedValue.ptr;
      if ((0 < (int)DAT_0145c358 && (this->field_0x28 & 2) == 0) &&
         (bVar14 = this->numDeletedProperties + 1, this->numDeletedProperties = bVar14,
         uVar3 <= bVar14)) {
        if (((this->field_0x28 & 4) == 0) &&
           (pRVar11 = ForInObjectEnumerator::GetFirstPrototypeWithEnumerableProperties
                                (&local_40->super_RecyclableObject,(RecyclableObject **)0x0),
           pRVar11 == (RecyclableObject *)0x0)) {
          bVar5 = Phases::IsEnabled((Phases *)&DAT_014594b0,TypeHandlerTransitionPhase);
          if (bVar5) {
            Output::Print(L"Transitioning to string keyed SimpleDictionaryUnorderedTypeHandler\n");
            Output::Flush();
          }
          pSVar12 = &SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>
                     ::
                     ConvertToSimpleDictionaryUnorderedTypeHandler<unsigned_short,Js::JavascriptString*,true>
                               ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>
                                 *)this,pDVar4)->
                     super_SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true>
          ;
          BVar8 = SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true>::
                  DeleteProperty(pSVar12,pDVar4,propertyNameString,local_34);
          return BVar8;
        }
        bVar5 = Phases::IsEnabled((Phases *)&DAT_014594b0,TypeHandlerTransitionPhase);
        if (bVar5) {
          Output::Print(
                       L"Transitioning to PropertyRecord keyed SimpleDictionaryUnorderedTypeHandler\n"
                       );
          Output::Flush();
        }
        this_01 = &SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>::
                   ConvertToSimpleDictionaryUnorderedTypeHandler<unsigned_short,Js::PropertyRecord_const*,true>
                             ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>
                               *)this,pDVar4)->
                   super_SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>
        ;
        BVar8 = DeleteProperty(this_01,pDVar4,propertyNameString,local_34);
        return BVar8;
      }
      pRVar1 = (this->singletonInstance).ptr;
      local_58 = pRVar11;
      if ((pRVar1 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
         ((DynamicObject *)(pRVar1->super_RecyclerWeakReferenceBase).strongRef != local_40)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x66f,
                                    "(this->singletonInstance == nullptr || instance == this->singletonInstance->Get())"
                                    ,
                                    "this->singletonInstance == nullptr || instance == this->singletonInstance->Get()"
                                   );
        if (!bVar5) {
LAB_00c5e2ff:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar9 = 0;
      }
      SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>::
      InvalidateFixedField<Js::JavascriptString*>
                ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true> *)
                 this,propertyNameString,local_48,
                 (((((local_40->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                 super_JavascriptLibraryBase).scriptContext.ptr);
      if (((this->super_DynamicTypeHandler).flags & 0x20) != 0) {
        iVar7 = (*(propertyNameString->super_RecyclableObject).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])
                          (propertyNameString);
        cVar6 = JavascriptString::GetLength(propertyNameString);
        this_00 = local_50;
        propertyId = ScriptContext::GetOrAddPropertyIdTracked
                               (local_50,(LPCWSTR)CONCAT44(extraout_var,iVar7),cVar6);
        ScriptContext::InvalidateProtoCaches(this_00,propertyId);
      }
      if (((this->field_0x28 & 2) == 0) ||
         (bVar5 = SimpleDictionaryUnorderedTypeHandler<unsigned_short,_const_Js::PropertyRecord_*,_true>
                  ::TryRegisterDeletedPropertyIndex
                            ((SimpleDictionaryUnorderedTypeHandler<unsigned_short,_const_Js::PropertyRecord_*,_true>
                              *)this,local_40,local_48->propertyIndex), !bVar5)) {
        DynamicTypeHandler::SetSlotUnchecked(local_40,(uint)local_48->propertyIndex,local_58);
      }
    }
    pDVar4 = local_40;
    local_48->Attributes = '\x0e';
    if ((char)((local_40->super_RecyclableObject).type.ptr)->flags < '\0') {
      DynamicObject::ChangeType(local_40);
    }
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              (&this->super_DynamicTypeHandler,pDVar4,&local_68,(Var)0x0,SideEffects_Any);
  }
  return 1;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::DeleteProperty(DynamicObject* instance, JavascriptString* propertyNameString, PropertyOperationFlags propertyOperationFlags)
    {
        AssertMsg(!PropertyRecord::IsPropertyNameNumeric(propertyNameString->GetString(), propertyNameString->GetLength()),
            "Numeric property names should have been converted to uint or PropertyRecord* ");

        if (!GetIsLocked())
        {
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            if (CONFIG_FLAG(ForceStringKeyedSimpleDictionaryTypeHandler) &&
                !TMapKey_IsJavascriptString<TMapKey>() &&
                !isUnordered && !hasNamelessPropertyId)
            {
                return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, JavascriptString*, IsNotExtensibleSupported>(instance)
                    ->DeleteProperty(instance, propertyNameString, propertyOperationFlags);
            }
#endif

            if (instance->GetDynamicType()->GetIsLocked())
            {
                Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                instance->ChangeType();
            }

            ScriptContext* scriptContext = instance->GetScriptContext();

            JsUtil::CharacterBuffer<WCHAR> propertyName(propertyNameString->GetString(), propertyNameString->GetLength());
            SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
            if (propertyMap->TryGetReference(propertyName, &descriptor))
            {
                if (descriptor->Attributes & PropertyDeleted)
                {
                    // If PropertyLetConstGlobal is present then we have a let/const and no global property,
                    // since SimpleDictionaryTypeHandler does not support shadowing which means it can only
                    // have one or the other.  Therefore return true for no property found if allowLetConstGlobal
                    // is false.  If allowLetConstGlobal is true we will enter the else if branch below and
                    // return false since let/const variables cannot be deleted.
                    return true;
                }
                else if (!(descriptor->Attributes & PropertyConfigurable))
                {
                    JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable(
                        propertyOperationFlags, scriptContext, propertyNameString->GetString()); // or propertyName->GetBuffer

                    return false;
                }
                Assert(!(descriptor->Attributes & PropertyLetConstGlobal));
                Var undefined = scriptContext->GetLibrary()->GetUndefined();
                if (descriptor->propertyIndex != NoSlots)
                {
                    if (SupportsSwitchingToUnordered(scriptContext))
                    {
                        ++numDeletedProperties;
                        if (numDeletedProperties >= CONFIG_FLAG(DeletedPropertyReuseThreshold))
                        {
                            // This type handler is being used as a hashtable. Start reusing deleted property indexes for new
                            // property IDs. After this, enumeration order is nondeterministic.
                            // Also use JavascriptString* as the property map key so that PropertyRecords can be avoided
                            // entirely where possible.

                            // Check if prototype chain has enumerable properties, according to logic used in
                            // ForInObjectEnumerator::Initialize().  If there are enumerable properties in the
                            // prototype chain, then enumerating this object's properties will require keeping
                            // track of properties so that shadowed properties are not included, but doing so
                            // currently requires converting the property to a PropertyRecord with a PropertyId
                            // for use in a bit vector that tracks shadowing.  To avoid having a string keyed
                            // type handler hit this, only convert to the string keyed type handler if the
                            // prototype chain does not have enumerable properties.
                            bool fConvertToStringKeyedHandler =
                                !hasNamelessPropertyId &&
                                ForInObjectEnumerator::GetFirstPrototypeWithEnumerableProperties(instance) == nullptr;

                            if (fConvertToStringKeyedHandler)
                            {
                                PHASE_PRINT_TESTTRACE1(Js::TypeHandlerTransitionPhase, _u("Transitioning to string keyed SimpleDictionaryUnorderedTypeHandler\n"));
                                // if TMapKey is already JavascriptString* we will not get here because we'd
                                // already be unordered and SupportsSwitchingToUnordered would have returned false
                                return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, JavascriptString*, IsNotExtensibleSupported>(instance)
                                    ->DeleteProperty(instance, propertyNameString, propertyOperationFlags);
                            }
                            else
                            {
                                PHASE_PRINT_TESTTRACE1(Js::TypeHandlerTransitionPhase, _u("Transitioning to PropertyRecord keyed SimpleDictionaryUnorderedTypeHandler\n"));
                                return ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, TMapKey, IsNotExtensibleSupported>(instance)
                                    ->DeleteProperty(instance, propertyNameString, propertyOperationFlags);
                            }
                        }
                    }

#if ENABLE_FIXED_FIELDS
                    Assert(this->singletonInstance == nullptr || instance == this->singletonInstance->Get());
                    InvalidateFixedField(propertyNameString, descriptor, instance->GetScriptContext());
#endif
                    if (this->GetFlags() & IsPrototypeFlag)
                    {
                        scriptContext->InvalidateProtoCaches(scriptContext->GetOrAddPropertyIdTracked(propertyNameString->GetSz(), propertyNameString->GetLength()));
                    }

                    // If this is an unordered type handler, register the deleted property index so that it can be reused for
                    // other property IDs added later
                    if (!isUnordered ||
                        !AsUnordered()->TryRegisterDeletedPropertyIndex(instance, descriptor->propertyIndex))
                    {
                        SetSlotUnchecked(instance, descriptor->propertyIndex, undefined);
                    }
                }
                descriptor->Attributes = PropertyDeletedDefaults;

                // Change the type so as we can invalidate the cache in fast path jit
                if (instance->GetType()->HasBeenCached())
                {
                    instance->ChangeType();
                }
                SetPropertyUpdateSideEffect(instance, propertyName, nullptr, SideEffects_Any);
                return true;
            }
        }
        else
        {
            SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported> *simpleBase = ConvertToNonSharedSimpleDictionaryType(instance);
            return simpleBase->DeleteProperty(instance, propertyNameString, propertyOperationFlags);
        }
        return true;
    }